

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_ExtensionRangeFeaturesDefault_Test::TestBody
          (FeaturesTest_ExtensionRangeFeaturesDefault_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  char *pcVar2;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffec0;
  AssertHelper local_f0;
  Message local_e8;
  FeatureSet local_e0;
  protobuf local_90 [8];
  char local_88 [8];
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  protobuf local_50 [8];
  char local_48 [8];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  ExtensionRange *range;
  FileDescriptor *local_18;
  FileDescriptor *file;
  FeaturesTest_ExtensionRangeFeaturesDefault_Test *this_local;
  
  file = (FileDescriptor *)this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&range,
             "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    message_type {\n      name: \"Foo\"\n      extension_range { start: 1 end: 100 }\n    }\n  "
            );
  local_18 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,_range);
  this_00 = FileDescriptor::message_type(local_18,0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Descriptor::extension_range(this_00,0);
  EqualsProto<char_const*>(local_50,anon_var_dwarf_37cdd0 + 5);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffec0._M_head_impl);
  Descriptor::ExtensionRange::options
            ((ExtensionRange *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            ((AssertionResult *)local_40,local_48,(ExtensionRangeOptions *)"range->options()");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x286b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  EqualsProto<char_const*>
            (local_90,
             "\n                field_presence: EXPLICIT\n                enum_type: OPEN\n                repeated_field_encoding: PACKED\n                utf8_validation: VERIFY\n                message_encoding: LENGTH_PREFIXED\n                json_format: ALLOW\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: false\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
            );
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffec0._M_head_impl);
  GetCoreFeatures<google::protobuf::Descriptor::ExtensionRange>
            (&local_e0,
             (ExtensionRange *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (local_80,local_88,(FeatureSet *)"GetCoreFeatures(range)");
  FeatureSet::~FeatureSet(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2879,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  return;
}

Assistant:

TEST_F(FeaturesTest, ExtensionRangeFeaturesDefault) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    message_type {
      name: "Foo"
      extension_range { start: 1 end: 100 }
    }
  )pb");
  const Descriptor::ExtensionRange* range =
      file->message_type(0)->extension_range(0);
  EXPECT_THAT(range->options(), EqualsProto(""));
  EXPECT_THAT(GetCoreFeatures(range), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: OPEN
                repeated_field_encoding: PACKED
                utf8_validation: VERIFY
                message_encoding: LENGTH_PREFIXED
                json_format: ALLOW
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: false
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
}